

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O3

TVector2<double> __thiscall TAngle<double>::ToVector(TAngle<double> *this,double length)

{
  double *in_RSI;
  double dVar1;
  double dVar2;
  TVector2<double> TVar3;
  
  dVar1 = FFastTrig::cos(&fasttrig,*in_RSI * 11930464.711111112 + 6755399441055744.0);
  dVar2 = FFastTrig::sin(&fasttrig,*in_RSI * 11930464.711111112 + 6755399441055744.0);
  TVar3.X = length * dVar1;
  this->Degrees = TVar3.X;
  this[1].Degrees = length * dVar2;
  TVar3.Y = dVar1;
  return TVar3;
}

Assistant:

TVector2<vec_t> ToVector(vec_t length = 1) const
	{
		return TVector2<vec_t>(length * Cos(), length * Sin());
	}